

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insert_ordered.h
# Opt level: O1

bool __thiscall
wasm::InsertOrderedSet<std::pair<wasm::Name,_wasm::Type>_>::insert
          (InsertOrderedSet<std::pair<wasm::Name,_wasm::Type>_> *this,
          pair<wasm::Name,_wasm::Type> *val)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  __hashtable *__h;
  pair<std::__detail::_Node_iterator<std::pair<const_std::pair<wasm::Name,_wasm::Type>,_std::_List_iterator<std::pair<wasm::Name,_wasm::Type>_>_>,_false,_true>,_bool>
  pVar4;
  
  pVar4 = std::
          _Hashtable<std::pair<wasm::Name,wasm::Type>,std::pair<std::pair<wasm::Name,wasm::Type>const,std::_List_iterator<std::pair<wasm::Name,wasm::Type>>>,std::allocator<std::pair<std::pair<wasm::Name,wasm::Type>const,std::_List_iterator<std::pair<wasm::Name,wasm::Type>>>>,std::__detail::_Select1st,std::equal_to<std::pair<wasm::Name,wasm::Type>>,std::hash<std::pair<wasm::Name,wasm::Type>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::
          _M_emplace<std::pair<std::pair<wasm::Name,wasm::Type>const,std::_List_iterator<std::pair<wasm::Name,wasm::Type>>>>
                    ();
  if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    p_Var3 = (_List_node_base *)operator_new(0x28);
    p_Var2 = (_List_node_base *)(val->first).super_IString.str._M_str;
    p_Var3[1]._M_next = (_List_node_base *)(val->first).super_IString.str._M_len;
    p_Var3[1]._M_prev = p_Var2;
    p_Var3[2]._M_next = (_List_node_base *)(val->second).id;
    std::__detail::_List_node_base::_M_hook(p_Var3);
    psVar1 = &(this->List).
              super__List_base<std::pair<wasm::Name,_wasm::Type>,_std::allocator<std::pair<wasm::Name,_wasm::Type>_>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    *(_List_node_base **)
     ((long)pVar4.first.
            super__Node_iterator_base<std::pair<const_std::pair<wasm::Name,_wasm::Type>,_std::_List_iterator<std::pair<wasm::Name,_wasm::Type>_>_>,_true>
            ._M_cur.
            super__Node_iterator_base<std::pair<const_std::pair<wasm::Name,_wasm::Type>,_std::_List_iterator<std::pair<wasm::Name,_wasm::Type>_>_>,_true>
     + 0x20) = (this->List).
               super__List_base<std::pair<wasm::Name,_wasm::Type>,_std::allocator<std::pair<wasm::Name,_wasm::Type>_>_>
               ._M_impl._M_node.super__List_node_base._M_prev;
  }
  return (bool)(pVar4.second & 1);
}

Assistant:

bool insert(const T& val) {
    auto [it, inserted] = Map.insert({val, List.begin()});
    if (inserted) {
      List.push_back(val);
      it->second = --List.end();
    }
    return inserted;
  }